

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O1

void test_list_empty(void)

{
  undefined8 ****ppppuVar1;
  LIST_NODE node;
  LIST list;
  undefined8 ***local_38;
  undefined8 ***local_30;
  undefined8 ***local_28;
  undefined8 ***local_20;
  
  local_28 = &local_28;
  local_20 = &local_28;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x3b,"%s","list_is_empty(&list)");
  local_38 = local_28;
  ppppuVar1 = (undefined8 ****)(local_28 + 1);
  local_30 = &local_28;
  local_28 = &local_38;
  *ppppuVar1 = &local_38;
  acutest_check_((uint)((undefined8 ****)local_20 != &local_28),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x3d,"%s","!list_is_empty(&list)");
  return;
}

Assistant:

static void
test_list_empty(void)
{
    LIST list;
    LIST_NODE node;

    list_init(&list);

    TEST_CHECK(list_is_empty(&list));
    list_append(&list, &node);
    TEST_CHECK(!list_is_empty(&list));
}